

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.cc
# Opt level: O1

void ipx::Transpose(SparseMatrix *A,SparseMatrix *AT)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  long lVar6;
  size_type sVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  size_type __n;
  uint nrow;
  vector<int,_std::allocator<int>_> work;
  allocator_type local_49;
  vector<int,_std::allocator<int>_> local_48;
  
  iVar8 = A->nrow_;
  piVar1 = (A->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar9 = piVar1[-1];
  nrow = (int)((ulong)((long)piVar1 -
                      (long)(A->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2) - 1;
  SparseMatrix::resize(AT,nrow,iVar8,iVar9);
  __n = (size_type)iVar8;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,&local_49);
  if (0 < (long)iVar9) {
    piVar1 = (A->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[piVar1[lVar6]] =
           local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[piVar1[lVar6]] + 1;
      lVar6 = lVar6 + 1;
    } while (iVar9 != lVar6);
  }
  piVar1 = (AT->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (iVar8 < 1) {
    iVar8 = 0;
  }
  else {
    sVar7 = 0;
    iVar9 = 0;
    do {
      piVar1[sVar7] = iVar9;
      iVar8 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[sVar7] + iVar9;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar7] = iVar9;
      sVar7 = sVar7 + 1;
      iVar9 = iVar8;
    } while (__n != sVar7);
  }
  piVar1[__n] = iVar8;
  if (0 < (int)nrow) {
    piVar1 = (A->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (A->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (AT->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (AT->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (A->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = 0;
    do {
      lVar6 = (long)piVar1[uVar10];
      if (piVar1[uVar10] < piVar1[uVar10 + 1]) {
        do {
          iVar8 = piVar2[lVar6];
          iVar9 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar8];
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar8] = iVar9 + 1;
          piVar3[iVar9] = (int)uVar10;
          pdVar4[iVar9] = pdVar5[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 < piVar1[uVar10 + 1]);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != nrow);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Transpose(const SparseMatrix& A, SparseMatrix& AT) {
    const Int m = A.rows();
    const Int n = A.cols();
    const Int nz = A.entries();
    AT.resize(n, m, nz);

    // Compute row counts of A in workspace.
    std::vector<Int> work(m);
    for (Int p = 0; p < nz; p++)
        work[A.index(p)]++;

    // Set column pointers for AT.
    Int* ATp = AT.colptr();
    Int sum = 0;
    for (Int i = 0; i < m; i++) {
        ATp[i] = sum;
        sum += work[i];
        work[i] = ATp[i];
    }
    assert(sum == nz);
    ATp[m] = sum;

    // Fill AT with one column of A at a time.
    // work[i] is the next free slot in column i of AT.
    for (Int j = 0; j < n; j++) {
        for (Int p = A.begin(j); p < A.end(j); p++) {
            Int put = work[A.index(p)]++;
            AT.index(put) = j;
            AT.value(put) = A.value(p);
        }
    }
}